

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# astcenc_compress_symbolic.cpp
# Opt level: O1

void compress_block(astcenc_contexti *ctx,image_block *blk,uint8_t *pcb,
                   compression_working_buffers *tmpbuf)

{
  endpoints_and_weights *ei2;
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  ushort uVar5;
  astcenc_profile decode_mode;
  uint uVar6;
  block_size_descriptor *bsd;
  float fVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  uint8_t *puVar13;
  uint8_t uVar14;
  uint uVar15;
  uint uVar16;
  partition_info *pi;
  long lVar17;
  decimation_info *pdVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  byte *pbVar22;
  char cVar23;
  uint16_t *puVar24;
  bool bVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined1 extraout_var_03 [60];
  undefined1 extraout_var_04 [60];
  undefined1 auVar35 [64];
  undefined1 auVar31 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar33 [16];
  undefined1 auVar38 [64];
  undefined1 auVar34 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [64];
  float fVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [64];
  undefined1 auVar61 [16];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  vfloat4 color0;
  vfloat4 color1;
  vfloat4 rgbs_color_00;
  vfloat4 rgbo_color_00;
  float errorval_mult [2];
  symbolic_compressed_block workscb;
  vfloat4 rgbo_color;
  vfloat4 rgbs_color;
  quant_method color_quant_level [8];
  int block_mode_index [8];
  uint8_t partition_format_specifiers [8] [4];
  endpoints epm;
  quant_method color_quant_level_mod [8];
  undefined1 local_500 [16];
  uint local_4f0;
  uint local_4d0;
  undefined1 local_4c0 [12];
  float afStack_4b4 [5];
  ulong local_4a0;
  float local_494;
  undefined1 local_490 [16];
  undefined8 local_480;
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined8 local_450;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [16];
  block_mode *local_428;
  ulong local_420;
  float local_418 [2];
  undefined1 local_410 [16];
  undefined4 local_400;
  undefined8 local_3fc;
  undefined4 local_3f4;
  undefined1 *local_3e8;
  uint16_t *local_3e0;
  float *local_3d8;
  int8_t *local_3d0;
  uint8_t *local_3c8;
  undefined8 local_3c0;
  uint local_3b8 [2];
  undefined8 local_3b0;
  uint local_3a8;
  undefined1 local_3a0 [128];
  undefined1 local_320 [128];
  vfloat4 local_2a0;
  vfloat4 local_290;
  quant_method local_280 [8];
  int local_260 [8];
  byte local_240 [32];
  endpoints local_220;
  quant_method local_110 [8];
  endpoints local_f0;
  undefined1 extraout_var_05 [60];
  undefined1 extraout_var_06 [60];
  undefined1 extraout_var_07 [60];
  undefined1 extraout_var_08 [60];
  
  puVar13 = (uint8_t *)CONCAT44(local_480._4_4_,(float)local_480);
  bsd = ctx->bsd;
  auVar28 = *(undefined1 (*) [16])(blk->data_min).m;
  auVar30 = *(undefined1 (*) [16])(blk->data_max).m;
  local_4a0 = (ulong)(ctx->config).tune_partition_count_limit;
  local_3b0._0_4_ = (ctx->config).tune_2partition_index_limit;
  local_3b0._4_4_ = (ctx->config).tune_3partition_index_limit;
  local_3a8 = (ctx->config).tune_4partition_index_limit;
  local_3c0._0_4_ = (ctx->config).tune_2partitioning_candidate_limit;
  local_3c0._4_4_ = (ctx->config).tune_3partitioning_candidate_limit;
  local_3b8[0] = (ctx->config).tune_4partitioning_candidate_limit;
  auVar41 = vcmpps_avx(auVar28,auVar30,4);
  if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf]) {
    local_320._1_7_ = SUB87(local_320._0_8_,1) & 0xffffffffffff00;
    if (((ctx->config).profile & ~ASTCENC_PRF_LDR) == ASTCENC_PRF_HDR_RGB_LDR_A) {
      local_320[0] = 1;
      auVar28 = vcvtps2ph_f16c(*(undefined1 (*) [16])(blk->origin_texel).m,0);
      auVar30 = vpmovzxwd_avx(auVar28);
    }
    else {
      local_320[0] = 2;
      auVar28 = vmaxps_avx(*(undefined1 (*) [16])(blk->origin_texel).m,ZEXT816(0) << 0x20);
      auVar41._8_4_ = 0x3f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._12_4_ = 0x3f800000;
      auVar28 = vminps_avx(auVar28,auVar41);
      auVar30._0_4_ = (int)(auVar28._0_4_ * 65535.0 + 0.5);
      auVar30._4_4_ = (int)(auVar28._4_4_ * 65535.0 + 0.5);
      auVar30._8_4_ = (int)(auVar28._8_4_ * 65535.0 + 0.5);
      auVar30._12_4_ = (int)(auVar28._12_4_ * 65535.0 + 0.5);
    }
    local_320._20_4_ = auVar30._0_4_;
    local_320._24_4_ = auVar30._4_4_;
    local_320._28_4_ = auVar30._8_4_;
    local_320._32_4_ = auVar30._12_4_;
  }
  else {
    auVar28 = vshufps_avx(auVar28,auVar28,0xff);
    uVar15 = *(uint *)(&DAT_00331d20 + (ulong)(blk->alpha_lns[0] == '\0') * 4);
    auVar30 = vshufps_avx(auVar30,auVar30,0xff);
    bVar25 = blk->grayscale != false;
    auVar53 = SUB6416(ZEXT464(0x3f800000),0);
    auVar41 = auVar53;
    if (bVar25) {
      auVar41 = SUB6416(ZEXT464(0x3f73cf3e),0);
    }
    auVar29 = vcmpss_avx(auVar30,ZEXT416(uVar15),4);
    auVar29 = vblendvps_avx(auVar53,auVar41,auVar29);
    auVar64 = vcmpss_avx(auVar28,ZEXT416(uVar15),4);
    local_3c8 = pcb;
    auVar65 = auVar53;
    if (bVar25) {
      auVar65 = SUB6416(ZEXT464(0x3f2aaaab),0);
    }
    auVar41 = vblendvps_avx(auVar29,auVar41,auVar64);
    auVar30 = vcmpss_avx(auVar30,ZEXT416(uVar15),0);
    auVar30 = vblendvps_avx(auVar53,auVar65,auVar30);
    auVar28 = vcmpss_avx(auVar28,ZEXT416(uVar15),0);
    auVar28 = vblendvps_avx(auVar53,auVar30,auVar28);
    uVar3 = *(undefined8 *)((blk->channel_weight).m + 2);
    fVar55 = (float)uVar3;
    auVar53._0_4_ = fVar55 + (blk->channel_weight).m[0];
    fVar26 = (float)((ulong)uVar3 >> 0x20);
    auVar53._4_4_ = fVar26 + (blk->channel_weight).m[1];
    auVar53._8_4_ = fVar55 + (blk->channel_weight).m[2];
    auVar53._12_4_ = fVar26 + (blk->channel_weight).m[3];
    auVar30 = vhaddps_avx(auVar53,auVar53);
    local_320._16_4_ = 1e+30;
    local_320._0_8_ = local_320._0_8_ & 0xffffffffffffff00;
    afStack_4b4[1] = 1e+30;
    afStack_4b4[2] = 1e+30;
    afStack_4b4[3] = 1e+30;
    afStack_4b4[4] = 1e+30;
    local_400 = 0;
    local_3fc._0_4_ = (ctx->config).tune_2partition_early_out_limit_factor;
    local_3fc._4_4_ = (ctx->config).tune_3partition_early_out_limit_factor;
    local_3f4 = 0;
    fVar55 = 1.0 / (ctx->config).tune_mse_overshoot;
    local_418[0] = fVar55;
    local_418[1] = 1.0;
    uVar19 = 1;
    if (0.85 <= (ctx->config).tune_search_mode0_enable) {
      uVar19 = (ulong)(bsd->zdim != '\x01');
    }
    local_440 = ZEXT416((uint)(auVar41._0_4_ *
                              auVar28._0_4_ *
                              auVar30._0_4_ * (float)bsd->texel_count * (ctx->config).tune_db_limit)
                       );
    auVar47 = ZEXT464(0x7149f2ca);
    bVar25 = false;
    do {
      fVar26 = (float)local_440._0_4_ * local_418[uVar19];
      auVar60._0_4_ =
           compress_symbolic_block_for_partition_1plane
                     (&ctx->config,bsd,blk,uVar19 == 0,fVar26 * fVar55,1,0,
                      (symbolic_compressed_block *)local_320,tmpbuf,0xb);
      puVar13 = (uint8_t *)CONCAT44(local_480._4_4_,(float)local_480);
      auVar60._4_60_ = extraout_var;
      uVar5 = bsd->block_mode_packed_index[(ulong)local_320._0_8_ >> 0x20 & 0xffff];
      if ((uVar5 == 0xffff) ||
         (bsd->block_mode_count_all < (uint)uVar5 || bsd->block_mode_count_all == (uint)uVar5)) {
        afStack_4b4[1] = (float)auVar47._0_4_;
        __assert_fail("packed_index != BLOCK_BAD_BLOCK_MODE && packed_index < this->block_mode_count_all"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_internal.h"
                      ,0x27f,
                      "const block_mode &block_size_descriptor::get_block_mode(unsigned int) const")
        ;
      }
      local_420 = (ulong)bsd->block_modes[uVar5].quant_mode;
      auVar28 = vminss_avx(ZEXT416(auVar47._0_4_),auVar60._0_16_);
      auVar47 = ZEXT1664(auVar28);
      if (auVar60._0_4_ < fVar26) break;
      uVar19 = uVar19 + 1;
      bVar25 = uVar19 != 1;
    } while (uVar19 == 1);
    afStack_4b4[1] = (float)auVar28._0_4_;
    if (bVar25) {
      if ((ulong)bsd->texel_count == 0) {
        __assert_fail("texels_per_block > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                      ,0x42f,"float prepare_block_statistics(int, const image_block &)");
      }
      uVar3 = *(undefined8 *)((blk->channel_weight).m + 2);
      fVar26 = (float)uVar3;
      auVar28._0_4_ = fVar26 + (blk->channel_weight).m[0];
      fVar27 = (float)((ulong)uVar3 >> 0x20);
      auVar28._4_4_ = fVar27 + (blk->channel_weight).m[1];
      auVar28._8_4_ = fVar26 + (blk->channel_weight).m[2];
      auVar28._12_4_ = fVar27 + (blk->channel_weight).m[3];
      auVar28 = vhaddps_avx(auVar28,auVar28);
      fVar27 = auVar28._0_4_ * 0.25;
      fVar26 = 0.0;
      if (fVar27 < 0.0) {
        __assert_fail("weight >= 0.0f",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                      ,0x433,"float prepare_block_statistics(int, const image_block &)");
      }
      uVar19 = 0;
      fVar67 = 0.0;
      fVar58 = 0.0;
      fVar52 = 0.0;
      fVar48 = 0.0;
      fVar72 = 0.0;
      fVar73 = 0.0;
      fVar74 = 0.0;
      fVar75 = 0.0;
      fVar68 = 0.0;
      fVar69 = 0.0;
      fVar70 = 0.0;
      fVar71 = 0.0;
      local_450._0_4_ = 0.0;
      local_450._4_4_ = 0.0;
      fStack_448 = 0.0;
      fStack_444 = 0.0;
      auVar28 = ZEXT416(0) << 0x20;
      do {
        fVar1 = blk->data_g[uVar19];
        fVar7 = fVar27 * blk->data_r[uVar19];
        fVar26 = fVar7 + fVar26;
        fVar58 = fVar58 + fVar7 * blk->data_r[uVar19];
        fVar2 = blk->data_b[uVar19];
        auVar30 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar2),0x10);
        auVar65._4_4_ = fVar7;
        auVar65._0_4_ = fVar7;
        auVar65._8_4_ = fVar7;
        auVar65._12_4_ = fVar7;
        fVar68 = fVar68 + auVar30._0_4_ * fVar7;
        fVar69 = fVar69 + auVar30._4_4_ * fVar7;
        fVar70 = fVar70 + auVar30._8_4_ * fVar7;
        fVar71 = fVar71 + auVar30._12_4_ * fVar7;
        fVar7 = fVar1 * fVar27;
        fVar52 = fVar1 * fVar7 + fVar52;
        auVar30 = vinsertps_avx(ZEXT416((uint)fVar2),ZEXT416((uint)blk->data_a[uVar19]),0x10);
        auVar66._0_4_ = auVar30._0_4_ * fVar27;
        auVar66._4_4_ = auVar30._4_4_ * fVar27;
        auVar66._8_4_ = auVar30._8_4_ * fVar27;
        auVar66._12_4_ = auVar30._12_4_ * fVar27;
        auVar29._0_4_ = auVar30._0_4_ * auVar66._0_4_ + auVar28._0_4_;
        auVar29._4_4_ = auVar30._4_4_ * auVar66._4_4_ + auVar28._4_4_;
        auVar29._8_4_ = auVar30._8_4_ * auVar66._8_4_ + auVar28._8_4_;
        auVar29._12_4_ = auVar30._12_4_ * auVar66._12_4_ + auVar28._12_4_;
        auVar28 = vinsertps_avx(ZEXT416((uint)blk->data_a[uVar19]),ZEXT416((uint)fVar2),0x10);
        fVar67 = fVar67 + fVar7;
        auVar30 = vinsertps_avx(auVar66,ZEXT416((uint)fVar7),0x10);
        auVar64._0_8_ = auVar30._0_8_;
        auVar64._8_8_ = auVar65._8_8_;
        auVar28 = vshufps_avx(auVar28,auVar28,0x10);
        auVar30 = vshufps_avx(auVar64,auVar64,0xd4);
        local_450._0_4_ = (float)local_450 + auVar30._0_4_ * auVar28._0_4_;
        local_450._4_4_ = local_450._4_4_ + auVar30._4_4_ * auVar28._4_4_;
        fStack_448 = fStack_448 + auVar30._8_4_ * auVar28._8_4_;
        fStack_444 = fStack_444 + auVar30._12_4_ * auVar28._12_4_;
        fVar72 = fVar72 + auVar66._0_4_;
        fVar73 = fVar73 + auVar66._4_4_;
        fVar74 = fVar74 + auVar66._8_4_;
        fVar75 = fVar75 + auVar66._12_4_;
        fVar48 = fVar27 + fVar48;
        uVar19 = uVar19 + 1;
        auVar28 = auVar29;
      } while (bsd->texel_count != uVar19);
      auVar28 = vmaxss_avx(ZEXT416((uint)fVar48),ZEXT416(0x33d6bf95));
      fVar48 = 1.0 / auVar28._0_4_;
      fVar58 = fVar58 - fVar26 * fVar48 * fVar26;
      fVar52 = fVar52 - fVar67 * fVar67 * fVar48;
      local_480._0_4_ = fVar72 * fVar48;
      local_480._4_4_ = fVar73 * fVar48;
      auVar40._0_4_ = fVar72 * (float)local_480;
      auVar40._4_4_ = fVar73 * local_480._4_4_;
      auVar40._8_4_ = fVar74 * fVar74 * fVar48;
      auVar40._12_4_ = fVar75 * fVar75 * fVar48;
      auVar28 = vsubps_avx(auVar29,auVar40);
      fVar27 = fVar58 * fVar52;
      local_460 = ZEXT416((uint)(fVar48 * fVar26));
      local_470 = ZEXT416((uint)(fVar67 * fVar48));
      fStack_478 = fVar74 * fVar48;
      fStack_474 = fVar75 * fVar48;
      if (fVar27 < 0.0) {
        auVar47._0_4_ = sqrtf(fVar27);
        auVar47._4_60_ = extraout_var_00;
        _local_4c0 = auVar47._0_16_;
      }
      else {
        _local_4c0 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
      }
      fVar27 = auVar28._0_4_;
      fVar26 = fVar58 * fVar27;
      if (fVar26 < 0.0) {
        auVar62._0_4_ = sqrtf(fVar26);
        auVar62._4_60_ = extraout_var_01;
        local_490 = auVar62._0_16_;
      }
      else {
        local_490 = vsqrtss_avx(ZEXT416((uint)fVar26),ZEXT416((uint)fVar26));
      }
      auVar28 = vmovshdup_avx(auVar28);
      fVar26 = auVar28._0_4_;
      fVar58 = fVar58 * fVar26;
      if (fVar58 < 0.0) {
        auVar63._0_4_ = sqrtf(fVar58);
        auVar63._4_60_ = extraout_var_02;
        auVar28 = auVar63._0_16_;
      }
      else {
        auVar28 = vsqrtss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      }
      fVar58 = fVar52 * fVar27;
      if (fVar58 < 0.0) {
        auVar36._0_4_ = sqrtf(fVar58);
        auVar36._4_60_ = extraout_var_03;
        local_410 = auVar36._0_16_;
      }
      else {
        local_410 = vsqrtss_avx(ZEXT416((uint)fVar58),ZEXT416((uint)fVar58));
      }
      fVar52 = fVar52 * fVar26;
      if (fVar52 < 0.0) {
        auVar51._0_4_ = sqrtf(fVar52);
        auVar51._4_60_ = extraout_var_04;
        auVar30 = auVar51._0_16_;
      }
      else {
        auVar30 = vsqrtss_avx(ZEXT416((uint)fVar52),ZEXT416((uint)fVar52));
      }
      auVar4._4_4_ = fVar73;
      auVar4._0_4_ = fVar72;
      auVar4._8_4_ = fVar74;
      auVar4._12_4_ = fVar75;
      auVar41 = vshufps_avx(auVar4,auVar4,0x45);
      fVar27 = fVar27 * fVar26;
      if (fVar27 < 0.0) {
        auVar35._0_4_ = sqrtf(fVar27);
        auVar35._4_60_ = extraout_var_05;
        auVar53 = auVar35._0_16_;
      }
      else {
        auVar53 = vsqrtss_avx(ZEXT416((uint)fVar27),ZEXT416((uint)fVar27));
      }
      auVar63 = ZEXT1664(auVar4);
      auVar60 = ZEXT464((uint)fVar67);
      auVar9._4_4_ = fVar69;
      auVar9._0_4_ = fVar68;
      auVar9._8_4_ = fVar70;
      auVar9._12_4_ = fVar71;
      auVar62 = ZEXT1664(auVar9);
      auVar11._8_4_ = fStack_448;
      auVar11._0_8_ = local_450;
      auVar11._12_4_ = fStack_444;
      auVar10._4_4_ = local_480._4_4_;
      auVar10._0_4_ = (float)local_480;
      auVar10._8_4_ = fStack_478;
      auVar10._12_4_ = fStack_474;
      auVar30 = vinsertps_avx(auVar53,auVar30,0x10);
      auVar30 = vinsertps_avx(auVar30,local_410,0x20);
      auVar28 = vinsertps_avx(auVar30,auVar28,0x30);
      auVar30 = vinsertps_avx(auVar10,local_470,0x10);
      auVar49._4_4_ = local_460._0_4_;
      auVar49._0_4_ = local_460._0_4_;
      auVar49._8_4_ = local_460._0_4_;
      auVar49._12_4_ = local_460._0_4_;
      auVar42._0_8_ = auVar30._0_8_;
      auVar42._8_8_ = auVar49._8_8_;
      auVar30 = vshufps_avx(auVar42,auVar42,0xd4);
      auVar43._0_4_ = auVar41._0_4_ * auVar30._0_4_;
      auVar43._4_4_ = auVar41._4_4_ * auVar30._4_4_;
      auVar43._8_4_ = auVar41._8_4_ * auVar30._8_4_;
      auVar43._12_4_ = auVar41._12_4_ * auVar30._12_4_;
      auVar30 = vsubps_avx(auVar11,auVar43);
      auVar56._8_4_ = 0x3f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar56._12_4_ = 0x3f800000;
      auVar47 = ZEXT1664(auVar56);
      auVar28 = vdivps_avx(auVar56,auVar28);
      auVar31._0_4_ = auVar30._0_4_ * auVar28._0_4_;
      auVar31._4_4_ = auVar30._4_4_ * auVar28._4_4_;
      auVar31._8_4_ = auVar30._8_4_ * auVar28._8_4_;
      auVar31._12_4_ = auVar30._12_4_ * auVar28._12_4_;
      auVar28 = vcmpps_avx(auVar31,ZEXT816(0) << 0x20,3);
      uVar15 = vmovmskps_avx(auVar28);
      fVar26 = auVar4._0_4_;
      auVar44._0_4_ = fVar67 * (float)local_460._0_4_;
      auVar44._4_4_ = fVar26 * (float)local_460._0_4_;
      auVar44._8_4_ = fVar26 * (float)local_460._0_4_;
      auVar44._12_4_ = fVar26 * (float)local_460._0_4_;
      auVar30 = vsubps_avx(auVar9,auVar44);
      auVar28 = vinsertps_avx(_local_4c0,local_490,0x10);
      auVar28 = vdivps_avx(auVar56,auVar28);
      auVar50._0_4_ = auVar30._0_4_ * auVar28._0_4_;
      auVar50._4_4_ = auVar30._4_4_ * auVar28._4_4_;
      auVar50._8_4_ = auVar30._8_4_ * auVar28._8_4_;
      auVar50._12_4_ = auVar30._12_4_ * auVar28._12_4_;
      auVar45._8_4_ = 0x7fffffff;
      auVar45._0_8_ = 0x7fffffff7fffffff;
      auVar45._12_4_ = 0x7fffffff;
      auVar30 = vcmpps_avx(auVar50,ZEXT816(0) << 0x20,3);
      auVar28 = vandps_avx(auVar50,auVar45);
      auVar28 = vblendvps_avx(auVar28,auVar56,auVar30);
      auVar30 = vmovshdup_avx(auVar28);
      auVar30 = vminss_avx(auVar28,auVar30);
      auVar28 = SUB6416(ZEXT464(0x3f800000),0);
      if ((uVar15 & 8) == 0) {
        auVar28 = vshufps_avx(auVar31,auVar31,0xff);
        auVar28 = vandps_avx(auVar28,auVar45);
      }
      auVar30 = vminss_avx(auVar30,auVar28);
      auVar28 = SUB6416(ZEXT464(0x3f800000),0);
      if ((uVar15 & 4) == 0) {
        auVar28 = vshufpd_avx(auVar31,auVar31,1);
        auVar28 = vandpd_avx(auVar28,auVar45);
      }
      auVar30 = vminss_avx(auVar30,auVar28);
      auVar28 = SUB6416(ZEXT464(0x3f800000),0);
      if ((uVar15 & 2) == 0) {
        auVar28 = vmovshdup_avx(auVar31);
        auVar28 = vandps_avx(auVar28,auVar45);
      }
      auVar30 = vminss_avx(auVar30,auVar28);
      auVar28 = SUB6416(ZEXT464(0x3f800000),0);
      if ((uVar15 & 1) == 0) {
        auVar28 = vandps_avx(auVar31,auVar45);
      }
      auVar28 = vminss_avx(auVar30,auVar28);
      local_494 = (ctx->config).tune_2plane_early_out_limit_correlation;
      local_460._0_4_ = fVar55 * (float)local_440._0_4_;
      uVar15 = 0xb;
      if ((int)(uint)local_420 < 0xb) {
        uVar15 = (uint)local_420;
      }
      ei2 = &tmpbuf->ei2;
      local_4c0._0_8_ = tmpbuf->dec_weights_ideal;
      puVar13 = tmpbuf->dec_weights_uquant;
      local_480._0_4_ = SUB84(puVar13,0);
      local_480._4_4_ = (float)((ulong)puVar13 >> 0x20);
      local_410._0_4_ = ~(-2 << ((byte)uVar15 & 0x1f));
      local_490._0_8_ = bsd->decimation_tables;
      local_3d0 = tmpbuf->qwt_bitcounts;
      local_3d8 = tmpbuf->qwt_errors;
      fVar55 = afStack_4b4[1] * 1.85;
      auVar36 = ZEXT1664(auVar28);
      local_3e0 = &bsd->decimation_modes[0].refprec_2planes;
      local_3e8 = &bsd->block_modes[0].field_0x5;
      local_4d0 = 3;
      local_428 = bsd->block_modes;
      do {
        if ((auVar36._0_4_ <= local_494) && ((local_4d0 == 3 || (blk->grayscale == false)))) {
          auVar32._4_4_ = local_4d0;
          auVar32._0_4_ = local_4d0;
          auVar32._8_4_ = local_4d0;
          auVar32._12_4_ = local_4d0;
          local_500 = vpcmpeqd_avx(auVar32,_DAT_0027d3d0);
          auVar30 = vcmpps_avx(*(undefined1 (*) [16])(blk->data_max).m,
                               *(undefined1 (*) [16])(blk->data_min).m,0);
          auVar30 = local_500 & auVar30;
          auVar36 = ZEXT464(auVar28._0_4_);
          if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar30 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar30 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar30[0xf]) {
            local_480 = puVar13;
            if ((ctx->config).tune_candidate_limit == 0) {
              __assert_fail("config.tune_candidate_limit > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                            ,0x2d6,
                            "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                           );
            }
            if ((ctx->config).tune_refinement_limit == 0) {
              __assert_fail("config.tune_refinement_limit > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                            ,0x2d7,
                            "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                           );
            }
            if (bsd->decimation_mode_count_selected == 0) {
              __assert_fail("bsd.decimation_mode_count_selected > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                            ,0x2d8,
                            "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                           );
            }
            auVar47 = ZEXT1664(auVar47._0_16_);
            auVar60 = ZEXT1664(auVar60._0_16_);
            auVar62 = ZEXT1664(auVar62._0_16_);
            auVar63 = ZEXT1664(auVar63._0_16_);
            compute_ideal_colors_and_weights_2planes(bsd,blk,local_4d0,&tmpbuf->ei1,ei2);
            if (bsd->decimation_mode_count_selected != 0) {
              uVar16 = 0;
              uVar19 = 0;
              pdVar18 = (decimation_info *)local_490._0_8_;
              puVar24 = local_3e0;
              do {
                if ((local_410._0_4_ & (uint)*puVar24) != 0) {
                  compute_ideal_weights_for_decimation
                            (&tmpbuf->ei1,pdVar18,(float *)(local_4c0._0_8_ + (ulong)uVar16 * 4));
                  compute_ideal_weights_for_decimation
                            (ei2,pdVar18,(float *)(local_4c0._0_8_ + (ulong)uVar16 * 4 + 0x80));
                }
                uVar19 = uVar19 + 1;
                uVar16 = uVar16 + 0x40;
                pdVar18 = pdVar18 + 1;
                puVar24 = puVar24 + 3;
              } while (uVar19 < bsd->decimation_mode_count_selected);
            }
            auVar30 = *(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt0[0].m;
            auVar53 = *(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt1[0].m;
            auVar41 = *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt0[0].m;
            uVar3 = *(undefined8 *)(tmpbuf->ei2).ep.endpt1[0].m;
            uVar8 = *(undefined8 *)((tmpbuf->ei2).ep.endpt1[0].m + 2);
            local_450._0_4_ = (float)uVar3;
            local_450._4_4_ = (float)((ulong)uVar3 >> 0x20);
            fStack_448 = (float)uVar8;
            fStack_444 = (float)((ulong)uVar8 >> 0x20);
            compute_angular_endpoints_2planes(bsd,(float *)local_4c0._0_8_,uVar15,tmpbuf);
            uVar19 = (ulong)bsd->block_mode_count_1plane_selected;
            uVar16 = bsd->block_mode_count_1plane_2plane_selected;
            if (bsd->block_mode_count_1plane_selected < uVar16) {
              auVar54._8_4_ = 0x3f800000;
              auVar54._0_8_ = 0x3f8000003f800000;
              auVar54._12_4_ = 0x3f800000;
              auVar29 = vsubps_avx(auVar54,auVar41);
              auVar12._4_4_ = local_450._4_4_;
              auVar12._0_4_ = (float)local_450;
              auVar12._8_4_ = fStack_448;
              auVar12._12_4_ = fStack_444;
              auVar41 = vsubps_avx(auVar12,auVar41);
              auVar64 = vdivps_avx(auVar29,auVar41);
              auVar57._8_4_ = 0x3f000000;
              auVar57._0_8_ = 0x3f0000003f000000;
              auVar57._12_4_ = 0x3f000000;
              auVar47 = ZEXT1664(auVar57);
              auVar41 = vcmpps_avx(auVar57,auVar64,1);
              auVar59._8_4_ = 0x41200000;
              auVar59._0_8_ = 0x4120000041200000;
              auVar59._12_4_ = 0x41200000;
              auVar60 = ZEXT1664(auVar59);
              auVar29 = vcmpps_avx(auVar64,auVar59,1);
              auVar41 = vandps_avx(auVar41,auVar29);
              auVar41 = vblendvps_avx(auVar59,auVar64,auVar41);
              auVar61._8_4_ = 0x7149f2ca;
              auVar61._0_8_ = 0x7149f2ca7149f2ca;
              auVar61._12_4_ = 0x7149f2ca;
              auVar62 = ZEXT1664(auVar61);
              auVar63 = ZEXT1664(local_500);
              auVar41 = vblendvps_avx(auVar61,auVar41,local_500);
              auVar29 = vshufps_avx(auVar41,auVar41,0xe);
              auVar41 = vminps_avx(auVar41,auVar29);
              auVar29 = vmovshdup_avx(auVar41);
              auVar29 = vminss_avx(auVar41,auVar29);
              auVar41 = vsubps_avx(auVar54,auVar30);
              auVar30 = vsubps_avx(auVar53,auVar30);
              auVar53 = vdivps_avx(auVar41,auVar30);
              auVar30 = vcmpps_avx(auVar57,auVar53,1);
              auVar41 = vcmpps_avx(auVar53,auVar59,1);
              auVar30 = vandps_avx(auVar30,auVar41);
              auVar30 = vblendvps_avx(auVar59,auVar53,auVar30);
              auVar30 = vblendvps_avx(auVar30,auVar61,local_500);
              auVar41 = vshufps_avx(auVar30,auVar30,0xe);
              auVar30 = vminps_avx(auVar30,auVar41);
              auVar41 = vmovshdup_avx(auVar30);
              auVar30 = vminss_avx(auVar30,auVar41);
              uVar20 = uVar19 << 6;
              pbVar22 = local_3e8 + uVar19 * 6;
              do {
                if ((*pbVar22 & 1) == 0) {
                  __assert_fail("bm.is_dual_plane",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                                ,0x32a,
                                "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                               );
                }
                if (uVar15 < pbVar22[-2]) {
                  tmpbuf->qwt_errors[uVar19] = 1e+38;
                }
                else {
                  tmpbuf->qwt_bitcounts[uVar19] = 'm' - pbVar22[-1];
                  if (auVar30._0_4_ * 1.02 < tmpbuf->weight_high_value1[uVar19]) {
                    tmpbuf->weight_high_value1[uVar19] = 1.0;
                  }
                  if (auVar29._0_4_ * 1.02 < tmpbuf->weight_high_value2[uVar19]) {
                    tmpbuf->weight_high_value2[uVar19] = 1.0;
                  }
                  pdVar18 = (decimation_info *)((ulong)pbVar22[-3] * 0x1fb80 + local_490._0_8_);
                  lVar17 = (ulong)pbVar22[-3] * 0x100;
                  compute_quantized_weights_for_decimation
                            (pdVar18,tmpbuf->weight_low_value1[uVar19],
                             tmpbuf->weight_high_value1[uVar19],(float *)(local_4c0._0_8_ + lVar17),
                             (float *)&local_220,local_480 + (uVar20 & 0xffffffff),(uint)pbVar22[-2]
                            );
                  compute_quantized_weights_for_decimation
                            (pdVar18,tmpbuf->weight_low_value2[uVar19],
                             tmpbuf->weight_high_value2[uVar19],
                             (float *)(local_4c0._0_8_ + 0x80 + lVar17),local_220.endpt1[3].m,
                             local_480 + (uVar20 & 0xffffffff) + 0x20,(uint)pbVar22[-2]);
                  fVar26 = compute_error_of_weight_set_2planes
                                     (&tmpbuf->ei1,ei2,pdVar18,(float *)&local_220,
                                      local_220.endpt1[3].m);
                  tmpbuf->qwt_errors[uVar19] = fVar26;
                }
                uVar19 = uVar19 + 1;
                uVar20 = uVar20 + 0x40;
                pbVar22 = pbVar22 + 6;
              } while (uVar16 != uVar19);
            }
            if ((tmpbuf->ei1).ep.partition_count != 1) {
              __assert_fail("partition_count == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                            ,0x2c,
                            "void merge_endpoints(const endpoints &, const endpoints &, unsigned int, endpoints &)"
                           );
            }
            local_220.partition_count = 1;
            local_220.endpt0[0].m =
                 (__m128)vblendvps_avx(*(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt0[0].m,
                                       *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt0[0].m,local_500)
            ;
            local_220.endpt1[0].m =
                 (__m128)vblendvps_avx(*(undefined1 (*) [16])(tmpbuf->ei1).ep.endpt1[0].m,
                                       *(undefined1 (*) [16])(tmpbuf->ei2).ep.endpt1[0].m,local_500)
            ;
            pi = block_size_descriptor::get_partition_info(bsd,1,0);
            uVar16 = compute_ideal_endpoint_formats
                               (pi,blk,&local_220,local_3d0,local_3d8,
                                (ctx->config).tune_candidate_limit,
                                bsd->block_mode_count_1plane_selected,
                                bsd->block_mode_count_1plane_2plane_selected,
                                (uint8_t (*) [4])local_240,local_260,local_280,local_110,tmpbuf);
            fVar26 = 1e+30;
            local_470._0_4_ = uVar16;
            puVar13 = local_480;
            if (uVar16 != 0) {
              auVar51 = ZEXT464((uint)local_320._16_4_);
              uVar16 = 0;
              auVar36 = ZEXT464(0x7149f2ca);
              do {
                local_500._0_4_ = uVar16;
                iVar21 = local_260[uVar16];
                local_480 = puVar13;
                if ((iVar21 < (int)bsd->block_mode_count_1plane_selected) ||
                   ((int)bsd->block_mode_count_1plane_2plane_selected <= iVar21)) {
                  __assert_fail("bm_packed_index >= static_cast<int>(bsd.block_mode_count_1plane_selected) && bm_packed_index < static_cast<int>(bsd.block_mode_count_1plane_2plane_selected)"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                                ,0x37b,
                                "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                               );
                }
                lVar17 = (ulong)local_428[iVar21].decimation_mode * 0x1fb80;
                uVar19 = (ulong)*(byte *)(local_490._0_8_ + 2 + lVar17);
                if (uVar19 == 0) {
                  __assert_fail("di.weight_count > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/astc-encoder/Source/astcenc_compress_symbolic.cpp"
                                ,0x380,
                                "float compress_symbolic_block_for_partition_2planes(const astcenc_config &, const block_size_descriptor &, const image_block &, float, unsigned int, symbolic_compressed_block &, compression_working_buffers &, int)"
                               );
                }
                local_450 = local_428 + iVar21;
                pdVar18 = (decimation_info *)(lVar17 + local_490._0_8_);
                auVar47 = ZEXT1664(auVar47._0_16_);
                auVar60 = ZEXT1664(auVar60._0_16_);
                auVar62 = ZEXT1664(auVar62._0_16_);
                auVar63 = ZEXT1664(auVar63._0_16_);
                memcpy(&local_f0,&local_220,0x90);
                uVar20 = 0;
                do {
                  local_3a0[uVar20 + 0x40] = local_480[uVar20 + (uint)(iVar21 << 6)];
                  local_3a0[uVar20 + 0x60] = local_480[uVar20 + (ulong)(uint)(iVar21 << 6) + 0x20];
                  uVar20 = uVar20 + 1;
                } while (uVar19 != uVar20);
                auVar36 = ZEXT464(auVar36._0_4_);
                auVar51 = ZEXT464(auVar51._0_4_);
                puVar13 = local_480;
                if ((ctx->config).tune_refinement_limit != 0) {
                  local_4f0 = 1;
                  iVar21 = -1;
                  do {
                    fVar26 = auVar51._0_4_;
                    uVar16 = auVar36._0_4_;
                    auVar47 = ZEXT1664(auVar47._0_16_);
                    auVar60 = ZEXT1664(auVar60._0_16_);
                    auVar62 = ZEXT1664(auVar62._0_16_);
                    auVar63 = ZEXT1664(auVar63._0_16_);
                    recompute_ideal_colors_2planes
                              (blk,bsd,pdVar18,local_3a0 + 0x40,local_3a0 + 0x60,&local_f0,
                               &local_290,&local_2a0,local_4d0);
                    uVar19 = (ulong)(uint)local_500._0_4_;
                    color0.m[2] = local_f0.endpt1[0].m[0];
                    color0.m[3] = local_f0.endpt1[0].m[1];
                    color0.m[0] = local_f0.endpt0[0].m[0];
                    color0.m[1] = local_f0.endpt0[0].m[1];
                    color1.m._8_8_ = local_2a0.m._0_8_;
                    color1.m[0] = local_290.m[0];
                    color1.m[1] = local_290.m[1];
                    rgbs_color_00.m._0_8_ = auVar47._0_8_;
                    rgbs_color_00.m._8_8_ = auVar60._0_8_;
                    rgbo_color_00.m._0_8_ = auVar62._0_8_;
                    rgbo_color_00.m._8_8_ = auVar63._0_8_;
                    uVar14 = pack_color_endpoints
                                       (color0,color1,rgbs_color_00,rgbo_color_00,
                                        (uint)*(byte *)((long)(local_220.endpt0 + -3) + uVar19 * 4),
                                        local_3a0 + 0x14,local_280[uVar19]);
                    auVar29 = auVar63._0_16_;
                    auVar53 = auVar62._0_16_;
                    auVar41 = auVar60._0_16_;
                    auVar30 = auVar47._0_16_;
                    local_3a0[8] = uVar14;
                    local_3a0[1] = '\x01';
                    local_3a0[2] = '\0';
                    local_3a0._6_2_ = 0;
                    local_3a0._12_4_ = local_280[uVar19];
                    local_3a0._4_2_ = local_450->mode_index;
                    local_3a0[3] = (int8_t)local_4d0;
                    local_3a0[0] = '\x03';
                    if (local_4f0 == 1) {
                      auVar37._0_4_ =
                           compute_symbolic_block_difference_2plane
                                     (&ctx->config,bsd,(symbolic_compressed_block *)local_3a0,blk);
                      auVar29 = auVar63._0_16_;
                      auVar53 = auVar62._0_16_;
                      auVar41 = auVar60._0_16_;
                      auVar30 = auVar47._0_16_;
                      auVar37._4_60_ = extraout_var_06;
                      auVar33 = auVar37._0_16_;
                      if ((auVar37._0_4_ == -1e+30) && (!NAN(auVar37._0_4_))) {
                        auVar33._0_8_ =
                             CONCAT44(extraout_var_06._0_4_,auVar37._0_4_) ^ 0x8000000080000000;
                        auVar33._8_4_ = extraout_var_06._4_4_ ^ 0x80000000;
                        auVar33._12_4_ = extraout_var_06._8_4_ ^ 0x80000000;
                        local_3a0[0] = '\0';
                      }
                      auVar51 = ZEXT464((uint)fVar26);
                      fVar27 = auVar33._0_4_;
                      if (fVar27 <= fVar26 * ((float)(ctx->config).tune_refinement_limit * 0.045 +
                                             1.08)) {
                        bVar25 = true;
                        if (fVar27 < fVar26) {
                          local_3a0._16_4_ = fVar27;
                          local_320._32_4_ = (undefined4)local_3a0._32_8_;
                          local_320._36_4_ = SUB84(local_3a0._32_8_,4);
                          local_320._40_8_ = local_3a0._40_8_;
                          local_320._48_8_ = local_3a0._48_8_;
                          local_320._56_8_ = local_3a0._56_8_;
                          local_320._64_8_ = local_3a0._64_8_;
                          local_320._72_8_ = local_3a0._72_8_;
                          local_320._80_8_ = local_3a0._80_8_;
                          local_320._88_8_ = local_3a0._88_8_;
                          local_320._96_32_ = local_3a0._96_32_;
                          local_320._0_8_ =
                               CONCAT26(local_3a0._6_2_,
                                        CONCAT24(local_3a0._4_2_,
                                                 CONCAT13(local_3a0[3],
                                                          CONCAT21(local_3a0._1_2_,local_3a0[0]))));
                          local_320[8] = local_3a0[8];
                          local_320[9] = local_3a0[9];
                          local_320[10] = local_3a0[10];
                          local_320[0xb] = local_3a0[0xb];
                          local_320._12_4_ = local_3a0._12_4_;
                          local_320._16_4_ = fVar27;
                          local_320._20_4_ = local_3a0._20_4_;
                          local_320._24_4_ = (undefined4)local_3a0._24_8_;
                          local_320._28_4_ = SUB84(local_3a0._24_8_,4);
                          bVar25 = (float)local_460._0_4_ <= fVar27;
                          if (!bVar25) {
                            local_500._0_4_ = local_470._0_4_;
                          }
                          auVar51 = ZEXT1664(auVar33);
                        }
                      }
                      else {
                        bVar25 = false;
                      }
                      fVar26 = auVar51._0_4_;
                      auVar64 = vminss_avx(auVar33,ZEXT416(uVar16));
                      uVar16 = auVar64._0_4_;
                      auVar36 = ZEXT1664(auVar64);
                      puVar13 = local_480;
                      if (!bVar25) break;
                    }
                    decode_mode = (ctx->config).profile;
                    if (pdVar18->weight_count == bsd->texel_count) {
                      auVar47 = ZEXT1664(auVar30);
                      auVar60 = ZEXT1664(auVar41);
                      auVar62 = ZEXT1664(auVar53);
                      auVar63 = ZEXT1664(auVar29);
                      bVar25 = realign_weights_undecimated
                                         (decode_mode,bsd,blk,(symbolic_compressed_block *)local_3a0
                                         );
                    }
                    else {
                      auVar47 = ZEXT1664(auVar30);
                      auVar60 = ZEXT1664(auVar41);
                      auVar62 = ZEXT1664(auVar53);
                      auVar63 = ZEXT1664(auVar29);
                      bVar25 = realign_weights_decimated
                                         (decode_mode,bsd,blk,(symbolic_compressed_block *)local_3a0
                                         );
                    }
                    auVar38._0_4_ =
                         compute_symbolic_block_difference_2plane
                                   (&ctx->config,bsd,(symbolic_compressed_block *)local_3a0,blk);
                    auVar38._4_60_ = extraout_var_07;
                    auVar34 = auVar38._0_16_;
                    if ((auVar38._0_4_ == -1e+30) && (!NAN(auVar38._0_4_))) {
                      auVar34._0_8_ =
                           CONCAT44(extraout_var_07._0_4_,auVar38._0_4_) ^ 0x8000000080000000;
                      auVar34._8_4_ = extraout_var_07._4_4_ ^ 0x80000000;
                      auVar34._12_4_ = extraout_var_07._8_4_ ^ 0x80000000;
                      local_3a0[0] = '\0';
                    }
                    auVar51 = ZEXT464((uint)fVar26);
                    uVar6 = (ctx->config).tune_refinement_limit;
                    fVar27 = auVar34._0_4_;
                    if (fVar27 <= fVar26 * ((float)(uVar6 + iVar21) * 0.045 + 1.0)) {
                      if (fVar27 < fVar26) {
                        local_3a0._16_4_ = fVar27;
                        local_320._32_4_ = (undefined4)local_3a0._32_8_;
                        local_320._36_4_ = SUB84(local_3a0._32_8_,4);
                        local_320._40_8_ = local_3a0._40_8_;
                        local_320._48_8_ = local_3a0._48_8_;
                        local_320._56_8_ = local_3a0._56_8_;
                        local_320._64_8_ = local_3a0._64_8_;
                        local_320._72_8_ = local_3a0._72_8_;
                        local_320._80_8_ = local_3a0._80_8_;
                        local_320._88_8_ = local_3a0._88_8_;
                        local_320._96_32_ = local_3a0._96_32_;
                        local_320._0_8_ =
                             CONCAT26(local_3a0._6_2_,
                                      CONCAT24(local_3a0._4_2_,
                                               CONCAT13(local_3a0[3],
                                                        CONCAT21(local_3a0._1_2_,local_3a0[0]))));
                        local_320[8] = local_3a0[8];
                        local_320[9] = local_3a0[9];
                        local_320[10] = local_3a0[10];
                        local_320[0xb] = local_3a0[0xb];
                        local_320._12_4_ = local_3a0._12_4_;
                        local_320._16_4_ = fVar27;
                        local_320._20_4_ = local_3a0._20_4_;
                        local_320._24_4_ = (undefined4)local_3a0._24_8_;
                        local_320._28_4_ = SUB84(local_3a0._24_8_,4);
                        if (fVar27 < (float)local_460._0_4_) {
                          bVar25 = false;
                          local_500._0_4_ = local_470._0_4_;
                        }
                        auVar51 = ZEXT1664(auVar34);
                      }
                    }
                    else {
                      bVar25 = false;
                    }
                    auVar30 = vminss_avx(auVar34,ZEXT416(uVar16));
                    auVar36 = ZEXT1664(auVar30);
                    puVar13 = local_480;
                    if (bVar25 == false) break;
                    iVar21 = iVar21 + -1;
                    bVar25 = local_4f0 < uVar6;
                    local_4f0 = local_4f0 + 1;
                  } while (bVar25);
                }
                fVar26 = auVar36._0_4_;
                uVar16 = local_500._0_4_ + 1;
              } while (uVar16 < (uint)local_470._0_4_);
            }
            if (fVar26 <= fVar55) {
              auVar36 = ZEXT464(auVar28._0_4_);
              if ((float)local_440._0_4_ <= fVar26) goto LAB_0026cfc2;
            }
            bVar25 = fVar26 <= fVar55;
            goto LAB_0026cfdd;
          }
        }
LAB_0026cfc2:
        bVar25 = local_4d0 != 0;
        local_4d0 = local_4d0 - 1;
      } while (bVar25);
      bVar25 = false;
LAB_0026cfdd:
      if (1 < (int)local_4a0 && !bVar25) {
        local_4a0 = local_4a0 + 1;
        uVar19 = 2;
        do {
          uVar15 = local_3b8[uVar19];
          uVar16 = *(uint *)((long)&local_3c8 + uVar19 * 4);
          if (uVar15 <= uVar16) {
            uVar16 = uVar15;
          }
          local_480 = puVar13;
          uVar15 = find_best_partition_candidates
                             (bsd,blk,(uint)uVar19,uVar15,&local_220.partition_count,uVar16);
          fVar55 = *(float *)(local_4c0 + uVar19 * 4 + 8);
          cVar23 = '\f';
          puVar13 = local_480;
          if (uVar15 != 0) {
            uVar20 = 0;
            do {
              auVar39._0_4_ =
                   compress_symbolic_block_for_partition_1plane
                             (&ctx->config,bsd,blk,false,(float)local_460._0_4_,(uint)uVar19,
                              (&((endpoints *)(local_220.endpt0 + -1))->partition_count)[uVar20],
                              (symbolic_compressed_block *)local_320,tmpbuf,(int)local_420);
              auVar39._4_60_ = extraout_var_08;
              auVar28 = vminss_avx(ZEXT416(*(uint *)(local_4c0 + uVar19 * 4 + 0xc)),auVar39._0_16_);
              fVar26 = *(float *)(local_410 + uVar19 * 4 + 0xc);
              *(float *)(local_4c0 + uVar19 * 4 + 0xc) = auVar28._0_4_;
              fVar26 = fVar26 * 1.85 * fVar55;
              puVar13 = local_480;
              if ((fVar26 < auVar28._0_4_) || (auVar39._0_4_ < local_440._0_4_)) {
                auVar30 = vcmpps_avx(auVar39._0_16_,local_440,5);
                auVar28 = vcmpps_avx(ZEXT416((uint)fVar26),auVar28,5);
                auVar28 = vandps_avx(auVar28,auVar30);
                cVar23 = (~auVar28[0] & 1) * '\x05';
                break;
              }
              uVar20 = uVar20 + 1;
            } while (uVar15 != uVar20);
          }
          if (cVar23 == '\f') {
            cVar23 = (fVar55 * *(float *)(local_410 + uVar19 * 4 + 0xc) <
                     *(float *)(local_4c0 + uVar19 * 4 + 0xc)) * '\x05';
          }
        } while ((cVar23 == '\0') && (uVar19 = uVar19 + 1, uVar19 != local_4a0));
      }
    }
    pcb = local_3c8;
    if (local_320[0] == '\0') {
      local_320[0] = 2;
      auVar28 = vmaxps_avx(*(undefined1 (*) [16])(blk->origin_texel).m,ZEXT816(0) << 0x40);
      auVar46._8_4_ = 0x3f800000;
      auVar46._0_8_ = 0x3f8000003f800000;
      auVar46._12_4_ = 0x3f800000;
      auVar28 = vminps_avx(auVar28,auVar46);
      local_320._20_4_ = (undefined4)(auVar28._0_4_ * 65535.0 + 0.5);
      local_320._24_4_ = (undefined4)(auVar28._4_4_ * 65535.0 + 0.5);
      local_320._28_4_ = (undefined4)(auVar28._8_4_ * 65535.0 + 0.5);
      local_320._32_4_ = (undefined4)(auVar28._12_4_ * 65535.0 + 0.5);
    }
  }
  local_480 = puVar13;
  symbolic_to_physical(bsd,(symbolic_compressed_block *)local_320,pcb);
  return;
}

Assistant:

void compress_block(
	const astcenc_contexti& ctx,
	const image_block& blk,
	uint8_t pcb[16],
	compression_working_buffers& tmpbuf)
{
	astcenc_profile decode_mode = ctx.config.profile;
	symbolic_compressed_block scb;
	const block_size_descriptor& bsd = *ctx.bsd;
	float lowest_correl;

	TRACE_NODE(node0, "block");
	trace_add_data("pos_x", blk.xpos);
	trace_add_data("pos_y", blk.ypos);
	trace_add_data("pos_z", blk.zpos);

	// Set stricter block targets for luminance data as we have more bits to play with
	bool block_is_l = blk.is_luminance();
	float block_is_l_scale = block_is_l ? 1.0f / 1.5f : 1.0f;

	// Set slightly stricter block targets for lumalpha data as we have more bits to play with
	bool block_is_la = blk.is_luminancealpha();
	float block_is_la_scale = block_is_la ? 1.0f / 1.05f : 1.0f;

	bool block_skip_two_plane = false;
	int max_partitions = ctx.config.tune_partition_count_limit;

	unsigned int requested_partition_indices[3] {
		ctx.config.tune_2partition_index_limit,
		ctx.config.tune_3partition_index_limit,
		ctx.config.tune_4partition_index_limit
	};

	unsigned int requested_partition_trials[3] {
		ctx.config.tune_2partitioning_candidate_limit,
		ctx.config.tune_3partitioning_candidate_limit,
		ctx.config.tune_4partitioning_candidate_limit
	};

#if defined(ASTCENC_DIAGNOSTICS)
	// Do this early in diagnostic builds so we can dump uniform metrics
	// for every block. Do it later in release builds to avoid redundant work!
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;

	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
	trace_add_data("lowest_correl", lowest_correl);
	trace_add_data("tune_error_threshold", error_threshold);
#endif

	// Detected a constant-color block
	if (all(blk.data_min == blk.data_max))
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 0);
		trace_add_data("plane_count", 1);

		scb.partition_count = 0;

		// Encode as FP16 if using HDR
		if ((decode_mode == ASTCENC_PRF_HDR) ||
		    (decode_mode == ASTCENC_PRF_HDR_RGB_LDR_A))
		{
			scb.block_type = SYM_BTYPE_CONST_F16;
			vint4 color_f16 = float_to_float16(blk.origin_texel);
			store(color_f16, scb.constant_color);
		}
		// Encode as UNORM16 if NOT using HDR
		else
		{
			scb.block_type = SYM_BTYPE_CONST_U16;
			vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
			vint4 color_u16 = float_to_int_rtn(color_f32);
			store(color_u16, scb.constant_color);
		}

		trace_add_data("exit", "quality hit");

		symbolic_to_physical(bsd, scb, pcb);
		return;
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	float error_weight_sum = hadd_s(blk.channel_weight) * bsd.texel_count;
	float error_threshold = ctx.config.tune_db_limit
	                      * error_weight_sum
	                      * block_is_l_scale
	                      * block_is_la_scale;
#endif

	// Set SCB and mode errors to a very high error value
	scb.errorval = ERROR_CALC_DEFAULT;
	scb.block_type = SYM_BTYPE_ERROR;

	float best_errorvals_for_pcount[BLOCK_MAX_PARTITIONS] {
		ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT, ERROR_CALC_DEFAULT
	};

	float exit_thresholds_for_pcount[BLOCK_MAX_PARTITIONS] {
		0.0f,
		ctx.config.tune_2partition_early_out_limit_factor,
		ctx.config.tune_3partition_early_out_limit_factor,
		0.0f
	};

	// Trial using 1 plane of weights and 1 partition.

	// Most of the time we test it twice, first with a mode cutoff of 0 and then with the specified
	// mode cutoff. This causes an early-out that speeds up encoding of easy blocks. However, this
	// optimization is disabled for 4x4 and 5x4 blocks where it nearly always slows down the
	// compression and slightly reduces image quality.

	float errorval_mult[2] {
		1.0f / ctx.config.tune_mse_overshoot,
		1.0f
	};

	const float errorval_overshoot = 1.0f / ctx.config.tune_mse_overshoot;

	// Only enable MODE0 fast path if enabled
	// Never enable for 3D blocks as no "always" block modes are available
	int start_trial = 1;
 	if ((ctx.config.tune_search_mode0_enable >= TUNE_MIN_SEARCH_MODE0) && (bsd.zdim == 1))
	{
		start_trial = 0;
	}

	int quant_limit = QUANT_32;
	for (int i = start_trial; i < 2; i++)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 1);
		trace_add_data("search_mode", i);

		float errorval = compress_symbolic_block_for_partition_1plane(
		    ctx.config, bsd, blk, i == 0,
		    error_threshold * errorval_mult[i] * errorval_overshoot,
		    1, 0,  scb, tmpbuf, QUANT_32);

		// Record the quant level so we can use the filter later searches
		const auto& bm = bsd.get_block_mode(scb.block_mode);
		quant_limit = bm.get_weight_quant_mode();

		best_errorvals_for_pcount[0] = astc::min(best_errorvals_for_pcount[0], errorval);
		if (errorval < (error_threshold * errorval_mult[i]))
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

#if !defined(ASTCENC_DIAGNOSTICS)
	lowest_correl = prepare_block_statistics(bsd.texel_count, blk);
#endif

	block_skip_two_plane = lowest_correl > ctx.config.tune_2plane_early_out_limit_correlation;

	// Test the four possible 1-partition, 2-planes modes. Do this in reverse, as
	// alpha is the most likely to be non-correlated if it is present in the data.
	for (int i = BLOCK_MAX_COMPONENTS - 1; i >= 0; i--)
	{
		TRACE_NODE(node1, "pass");
		trace_add_data("partition_count", 1);
		trace_add_data("plane_count", 2);
		trace_add_data("plane_component", i);

		if (block_skip_two_plane)
		{
			trace_add_data("skip", "tune_2plane_early_out_limit_correlation");
			continue;
		}

		if (blk.grayscale && i != 3)
		{
			trace_add_data("skip", "grayscale block");
			continue;
		}

		if (blk.is_constant_channel(i))
		{
			trace_add_data("skip", "constant component");
			continue;
		}

		float errorval = compress_symbolic_block_for_partition_2planes(
		    ctx.config, bsd, blk, error_threshold * errorval_overshoot,
		    i, scb, tmpbuf, quant_limit);

		// If attempting two planes is much worse than the best one plane result
		// then further two plane searches are unlikely to help so move on ...
		if (errorval > (best_errorvals_for_pcount[0] * 1.85f))
		{
			break;
		}

		if (errorval < error_threshold)
		{
			trace_add_data("exit", "quality hit");
			goto END_OF_TESTS;
		}
	}

	// Find best blocks for 2, 3 and 4 partitions
	for (int partition_count = 2; partition_count <= max_partitions; partition_count++)
	{
		unsigned int partition_indices[TUNE_MAX_PARTITIONING_CANDIDATES];

		unsigned int requested_indices = requested_partition_indices[partition_count - 2];

		unsigned int requested_trials = requested_partition_trials[partition_count - 2];
		requested_trials = astc::min(requested_trials, requested_indices);

		unsigned int actual_trials = find_best_partition_candidates(
		    bsd, blk, partition_count, requested_indices, partition_indices, requested_trials);

		float best_error_in_prev = best_errorvals_for_pcount[partition_count - 2];

		for (unsigned int i = 0; i < actual_trials; i++)
		{
			TRACE_NODE(node1, "pass");
			trace_add_data("partition_count", partition_count);
			trace_add_data("partition_index", partition_indices[i]);
			trace_add_data("plane_count", 1);
			trace_add_data("search_mode", i);

			float errorval = compress_symbolic_block_for_partition_1plane(
			    ctx.config, bsd, blk, false,
			    error_threshold * errorval_overshoot,
			    partition_count, partition_indices[i],
			    scb, tmpbuf, quant_limit);

			best_errorvals_for_pcount[partition_count - 1] = astc::min(best_errorvals_for_pcount[partition_count - 1], errorval);

			// If using N partitions doesn't improve much over using N-1 partitions then skip trying
			// N+1. Error can dramatically improve if the data is correlated or non-correlated and
			// aligns with a partitioning that suits that encoding, so for this inner loop check add
			// a large error scale because the "other" trial could be a lot better.
			float best_error = best_errorvals_for_pcount[partition_count - 1];
			float best_error_scale = exit_thresholds_for_pcount[partition_count - 1] * 1.85f;
			if (best_error > (best_error_in_prev * best_error_scale))
			{
				trace_add_data("skip", "tune_partition_early_out_limit_factor");
				goto END_OF_TESTS;
			}

			if (errorval < error_threshold)
			{
				trace_add_data("exit", "quality hit");
				goto END_OF_TESTS;
			}
		}

		// If using N partitions doesn't improve much over using N-1 partitions then skip trying N+1
		float best_error = best_errorvals_for_pcount[partition_count - 1];
		float best_error_scale = exit_thresholds_for_pcount[partition_count - 1];
		if (best_error > (best_error_in_prev * best_error_scale))
		{
			trace_add_data("skip", "tune_partition_early_out_limit_factor");
			goto END_OF_TESTS;
		}
	}

	trace_add_data("exit", "quality not hit");

END_OF_TESTS:
	// If we still have an error block then convert to something we can encode
	// TODO: Do something more sensible here, such as average color block
	if (scb.block_type == SYM_BTYPE_ERROR)
	{
#if defined(ASTCENC_DIAGNOSTICS)
		static bool printed_once = false;
		if (!printed_once)
		{
			printed_once = true;
			printf("WARN: At least one block failed to find a valid encoding.\n"
			       "      Try increasing compression quality settings.\n\n");
		}
#endif

		scb.block_type = SYM_BTYPE_CONST_U16;
		vfloat4 color_f32 = clamp(0.0f, 1.0f, blk.origin_texel) * 65535.0f;
		vint4 color_u16 = float_to_int_rtn(color_f32);
		store(color_u16, scb.constant_color);
	}

	// Compress to a physical block
	symbolic_to_physical(bsd, scb, pcb);
}